

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseEncoder.cpp
# Opt level: O2

void __thiscall
siamese::EncoderPacketWindow::RemoveBefore(EncoderPacketWindow *this,uint firstKeptColumn)

{
  ostringstream *poVar1;
  OutputWorker *pOVar2;
  uint uVar3;
  LogStringBuffer local_1a8;
  
  if (this->EmergencyDisabled == false) {
    uVar3 = firstKeptColumn - this->ColumnStart & 0x3fffff;
    if (uVar3 < this->Count) {
      if (DAT_001ff848 < 3) {
        poVar1 = &local_1a8.LogStream;
        local_1a8.ChannelName = Logger;
        local_1a8.LogLevel = Info;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
        std::operator<<((ostream *)poVar1,(string *)&DAT_001ff878);
        std::operator<<((ostream *)poVar1,"Remove before column ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::operator<<((ostream *)poVar1," element ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        pOVar2 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar2,&local_1a8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      }
      if (this->FirstUnremovedElement < uVar3) {
        this->FirstUnremovedElement = uVar3;
      }
    }
    else {
      if (uVar3 < 0x200000) {
        this->Count = 0;
        if (2 < DAT_001ff848) {
          return;
        }
        poVar1 = &local_1a8.LogStream;
        local_1a8.ChannelName = Logger;
        local_1a8.LogLevel = Info;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
        std::operator<<((ostream *)poVar1,(string *)&DAT_001ff878);
        std::operator<<((ostream *)poVar1,"Remove before column ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::operator<<((ostream *)poVar1," - Removed everything");
        pOVar2 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar2,&local_1a8);
      }
      else {
        if (2 < DAT_001ff848) {
          return;
        }
        poVar1 = &local_1a8.LogStream;
        local_1a8.ChannelName = Logger;
        local_1a8.LogLevel = Info;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
        std::operator<<((ostream *)poVar1,(string *)&DAT_001ff878);
        std::operator<<((ostream *)poVar1,"Remove before column ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::operator<<((ostream *)poVar1," - Ignored before window");
        pOVar2 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar2,&local_1a8);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8.LogStream);
    }
  }
  return;
}

Assistant:

void EncoderPacketWindow::RemoveBefore(unsigned firstKeptColumn)
{
    if (EmergencyDisabled) {
        return;
    }

    // Convert column to element, handling wrap-around:
    const unsigned firstKeptElement = ColumnToElement(firstKeptColumn);

    // If the column is outside of the window:
    if (InvalidElement(firstKeptElement))
    {
        // If the element was before the window:
        if (IsColumnDeltaNegative(firstKeptElement)) {
            Logger.Info("Remove before column ", firstKeptColumn, " - Ignored before window");
        }
        else
        {
            // Removed everything
            Count = 0;

            Logger.Info("Remove before column ", firstKeptColumn, " - Removed everything");
        }
    }
    else
    {
        Logger.Info("Remove before column ", firstKeptColumn, " element ", firstKeptElement);

        // Mark these elements for removal next time we generate output
        if (FirstUnremovedElement < firstKeptElement) {
            FirstUnremovedElement = firstKeptElement;
        }
    }
}